

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_finding_on_map.hpp
# Opt level: O3

vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_> * __thiscall
graph_tests::PathFindingOnMap::GetNeighbors
          (vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>
           *__return_storage_ptr__,PathFindingOnMap *this,PointOnMap *u)

{
  char *pcVar1;
  pointer *ppPVar2;
  PointOnMap *__args;
  char cVar3;
  size_t sVar4;
  iterator __position;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  ParamType *pPVar11;
  long lVar12;
  PointOnMap local_98;
  char local_80 [8];
  long local_78;
  size_t local_70;
  char local_68;
  undefined1 local_60;
  optional<graph_tests::PointOnMap> local_58;
  optional<graph_tests::PointOnMap> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar11 = testing::WithParamInterface<graph_tests::PathFindingOnMapCase>::GetParam();
  sVar4 = u->j;
  if (sVar4 == 0) {
LAB_001152ca:
    local_80[0] = '\0';
  }
  else {
    cVar3 = (pPVar11->map).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[u->i]._M_dataplus._M_p[sVar4 + -1];
    if (cVar3 == '#') goto LAB_001152ca;
    local_98.j = sVar4 - 1;
    local_80[0] = '\x01';
    local_98.i = u->i;
    local_98.type = cVar3;
  }
  pPVar11 = testing::WithParamInterface<graph_tests::PathFindingOnMapCase>::GetParam();
  if (u->i != 0) {
    lVar12 = u->i - 1;
    cVar3 = (pPVar11->map).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_dataplus._M_p[u->j];
    if (cVar3 != '#') {
      local_60 = 1;
      local_78 = lVar12;
      local_70 = u->j;
      local_68 = cVar3;
      goto LAB_00115322;
    }
  }
  local_60 = 0;
LAB_00115322:
  GetRight(&local_58,this,u);
  GetDown(&local_38,this,u);
  lVar12 = 0;
  do {
    if (local_80[lVar12] == '\x01') {
      __args = (PointOnMap *)((long)&local_98.i + lVar12);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>>::
        _M_realloc_insert<graph_tests::PointOnMap_const>
                  ((vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>> *)
                   __return_storage_ptr__,__position,__args);
      }
      else {
        pcVar1 = local_80 + lVar12 + -8;
        cVar3 = pcVar1[1];
        cVar5 = pcVar1[2];
        cVar6 = pcVar1[3];
        cVar7 = pcVar1[4];
        cVar8 = pcVar1[5];
        cVar9 = pcVar1[6];
        cVar10 = pcVar1[7];
        (__position._M_current)->type = pcVar1[0];
        (__position._M_current)->field_0x11 = cVar3;
        (__position._M_current)->field_0x12 = cVar5;
        (__position._M_current)->field_0x13 = cVar6;
        (__position._M_current)->field_0x14 = cVar7;
        (__position._M_current)->field_0x15 = cVar8;
        (__position._M_current)->field_0x16 = cVar9;
        (__position._M_current)->field_0x17 = cVar10;
        sVar4 = *(size_t *)(local_80 + lVar12 + -0x10);
        (__position._M_current)->i = __args->i;
        (__position._M_current)->j = sVar4;
        ppPVar2 = &(__return_storage_ptr__->
                   super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppPVar2 = *ppPVar2 + 1;
      }
    }
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<PointOnMap> GetNeighbors(const PointOnMap& u) const {
    std::vector<PointOnMap> res;
    for (auto&& neigbor : { GetLeft(u), GetUp(u), GetRight(u), GetDown(u) }) {
      if (neigbor)
        res.emplace_back(std::move(*neigbor));
    }
    return res;
  }